

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O1

void vocdel1(voccxdef *ctx,objnum objn,char *wrd1,prpnum prp,int really_delete,int revert,
            int keep_undo)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint *puVar4;
  vocdef *pvVar5;
  vocdef *pvVar6;
  uint *puVar7;
  uint *puVar8;
  vocdef *pvVar9;
  vocdef *pvVar10;
  vocdef *pvVar11;
  uint *puVar12;
  uint uVar13;
  byte bVar14;
  int len1;
  int len2;
  char *wrd2;
  uint local_94;
  char *local_90;
  char *local_88;
  int local_7c;
  int local_78;
  uint local_74;
  vocdef *local_70;
  undefined8 local_68;
  vocdef *local_60;
  vocdef *local_58;
  vocdef *local_50;
  vocdef *local_48;
  uint *local_40;
  char *local_38;
  
  local_90 = wrd1;
  local_88 = wrd1;
  local_78 = really_delete;
  if (wrd1 != (char *)0x0) {
    voc_parse_words(&local_88,(int *)&local_94,&local_38,(int *)&local_74);
  }
  pvVar10 = (vocdef *)ctx->voccxhsh;
  bVar3 = keep_undo != 0 && local_90 != (char *)0x0;
  local_7c = 0x100;
  do {
    if (pvVar10->vocnxt != (vocdef *)0x0) {
      pvVar5 = pvVar10->vocnxt;
      pvVar11 = (vocdef *)0x0;
      local_58 = pvVar10;
      do {
        pvVar6 = pvVar5->vocnxt;
        pvVar9 = pvVar5;
        if (local_88 == (char *)0x0) {
LAB_0013805f:
          uVar13 = pvVar5->vocwlst;
          if (uVar13 == 0xffffffff) {
            puVar8 = (uint *)0x0;
          }
          else {
            puVar8 = (uint *)((long)&ctx->voccxwp[(ulong)uVar13 / 2000]->vocwnxt +
                             (ulong)(uVar13 % 2000 << 3));
          }
          local_70 = pvVar11;
          if (puVar8 != (uint *)0x0) {
            local_40 = &pvVar5->vocwlst;
            local_48 = pvVar11;
            if (pvVar11 == (vocdef *)0x0) {
              local_48 = pvVar10;
            }
            local_68 = 0;
            puVar7 = (uint *)0x0;
            local_60 = pvVar5;
            local_50 = pvVar6;
            do {
              uVar1 = *puVar8;
              if (uVar1 == 0xffffffff) {
                puVar12 = (uint *)0x0;
              }
              else {
                puVar12 = (uint *)((long)&ctx->voccxwp[(ulong)uVar1 / 2000]->vocwnxt +
                                  (ulong)(uVar1 % 2000 << 3));
              }
              if (revert == 0) {
                bVar14 = false;
                if (*(objnum *)(puVar8 + 1) == objn) {
                  if (local_88 == (char *)0x0) {
                    bVar14 = true;
                  }
                  else {
                    bVar14 = *(byte *)((long)puVar8 + 6) == prp;
                  }
                }
                if ((local_78 == 0) && ((bool)bVar14 != false)) {
                  bVar14 = 1;
                  if ((*(byte *)((long)puVar8 + 7) & 4) == 0) {
                    if (bVar3) {
                      vocdusave_delwrd(ctx,objn,prp,(uint)*(byte *)((long)puVar8 + 7),local_90);
                    }
                    *(byte *)((long)puVar8 + 7) = *(byte *)((long)puVar8 + 7) | 8;
                    bVar14 = 0;
                  }
                }
              }
              else {
                bVar14 = *(byte *)((long)puVar8 + 7) & 4;
                *(byte *)((long)puVar8 + 7) = *(byte *)((long)puVar8 + 7) & 0xf7;
              }
              if (bVar14 != 0) {
                if (bVar3) {
                  vocdusave_delwrd(ctx,objn,prp,(uint)*(byte *)((long)puVar8 + 7),local_90);
                }
                puVar4 = puVar7;
                if (puVar7 == (uint *)0x0) {
                  puVar4 = local_40;
                }
                *puVar4 = *puVar8;
                *puVar8 = ctx->voccxwfre;
                ctx->voccxwfre = uVar13;
                puVar8 = puVar7;
                if (*local_40 == 0xffffffff) {
                  local_48->vocnxt = local_60->vocnxt;
                  local_60->vocnxt = ctx->voccxfre;
                  ctx->voccxfre = local_60;
                  local_68 = 1;
                }
              }
              puVar7 = puVar8;
              puVar8 = puVar12;
              uVar13 = uVar1;
            } while (puVar12 != (uint *)0x0);
            pvVar6 = local_50;
            pvVar9 = local_60;
            pvVar10 = local_58;
            if ((int)local_68 != 0) {
              pvVar9 = local_70;
            }
          }
        }
        else if (local_94 == pvVar5->voclen) {
          iVar2 = memicmp(pvVar5->voctxt,local_88,(ulong)local_94);
          if ((iVar2 == 0) &&
             ((local_38 == (char *)0x0 ||
              ((local_74 == pvVar5->vocln2 &&
               (iVar2 = memicmp(pvVar5->voctxt + (int)local_94,local_38,(ulong)local_74), iVar2 == 0
               )))))) goto LAB_0013805f;
        }
        pvVar5 = pvVar6;
        pvVar11 = pvVar9;
      } while (pvVar6 != (vocdef *)0x0);
    }
    pvVar10 = (vocdef *)&pvVar10->voclen;
    local_7c = local_7c + -1;
    if (local_7c == 0) {
      return;
    }
  } while( true );
}

Assistant:

void vocdel1(voccxdef *ctx, objnum objn, char *wrd1, prpnum prp,
             int really_delete, int revert, int keep_undo)
{
    int       i;
    vocdef   *v;
    vocdef   *prv;
    vocdef   *nxt;
    vocdef  **vp;
    vocwdef  *vw;
    vocwdef  *prvw;
    vocwdef  *nxtw;
    uint      nxtidx;
    uint      idx;
    int       deleted_vocdef;
    char     *wrd2;
    int       len1, len2;
    int       do_del;
    char     *orgwrd;

    /* parse the word if provided */
    orgwrd = wrd1;
    if (wrd1)
        voc_parse_words(&wrd1, &len1, &wrd2, &len2);
    
    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (prv = (vocdef *)0, v = *vp ; v ; v = nxt)
        {
            /* remember next word in hash chain */
            nxt = v->vocnxt;

            /* if this word doesn't match, skip it */
            if (wrd1)
            {
                /* compare the first word */
                if (v->voclen != len1
                    || memicmp((char *)v->voctxt, wrd1, (size_t)len1))
                {
                    prv = v;
                    continue;
                }

                /* if there's a second word, compare it as well */
                if (wrd2 && (v->vocln2 != len2
                             || memicmp((char *)v->voctxt + len1,
                                        wrd2, (size_t)len2)))
                {
                    prv = v;
                    continue;
                }
            }

            /* presume we're not going to delete this vocdef */
            deleted_vocdef = FALSE;
            
            /* go through all object relations for this word */
            for (prvw = 0, idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 vw = nxtw, idx = nxtidx)
            {
                /* remember next word in relation list */
                nxtidx = vw->vocwnxt;
                nxtw = vocwget(ctx, nxtidx);

                /*
                 *   figure out whether to delete this word, based on the
                 *   caller's specified operating mode 
                 */
                if (revert)
                {
                    /* if reverting, delete all new words */
                    do_del = (vw->vocwflg & VOCFNEW);

                    /* also, remove the DELETED flag if present */
                    vw->vocwflg &= ~VOCFDEL;
                }
                else
                {
                    /*
                     *   delete the word if the object number matches,
                     *   AND either we're not searching for a specific
                     *   vocabulary word (in which case wrd1 will be null)
                     *   or the word matches the vocabulary word we're
                     *   seeking (in which case the part of speech must
                     *   match) 
                     */
                    do_del = (vw->vocwobj == objn
                              && (wrd1 == 0 || vw->vocwtyp == prp));

                    /*
                     *   if we're not in really_delete mode, and the word
                     *   matches and it wasn't dynamically added at
                     *   run-time, simply mark it as deleted -- this will
                     *   allow it to be undeleted if the game is reverted
                     *   to RESTART conditions 
                     */
                    if (do_del && !really_delete && !(vw->vocwflg & VOCFNEW))
                    {
                        /* geneate undo for the operation */
                        if (keep_undo && orgwrd)
                            vocdusave_delwrd(ctx, objn, prp,
                                             vw->vocwflg, orgwrd);
                        
                        /* just mark the word for deletion, but keep vw */
                        vw->vocwflg |= VOCFDEL;
                        do_del = FALSE;
                    }
                }

                /* now delete the structure if we decided we should */
                if (do_del)
                {
                    /* geneate undo for the operation */
                    if (keep_undo && orgwrd)
                        vocdusave_delwrd(ctx, objn, prp, vw->vocwflg, orgwrd);
                                         
                    /* unlink this vocwdef from the vocdef's list */
                    if (prvw)
                        prvw->vocwnxt = vw->vocwnxt;
                    else
                        v->vocwlst = vw->vocwnxt;

                    /* link the vocwdef into the vocwdef free list */
                    vw->vocwnxt = ctx->voccxwfre;
                    ctx->voccxwfre = idx;

                    /*
                     *   if there's nothing left in the vocdef's list,
                     *   delete the entire vocdef as well 
                     */
                    if (v->vocwlst == VOCCXW_NONE)
                    {
                        if (prv) prv->vocnxt = v->vocnxt;
                        else *vp = v->vocnxt;
                    
                        /* link into free chain */
                        v->vocnxt = ctx->voccxfre;
                        ctx->voccxfre = v;

                        /* note that it's been deleted */
                        deleted_vocdef = TRUE;
                    }
                }
                else
                {
                    /* we're not deleting the word, so move prvw forward */
                    prvw = vw;
                }
            }

            /* if we didn't delete this vocdef, move prv forward onto it */
            if (!deleted_vocdef)
                prv = v;
        }
    }
}